

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# regcomp.c
# Opt level: O3

int onig_is_code_in_cc_len(int elen,OnigCodePoint code,void *cc_arg)

{
  uint uVar1;
  
  if (elen < 2 && code < 0x100) {
    uVar1 = (uint)((*(uint *)((long)cc_arg + (ulong)(code >> 5) * 4 + 0x14) >> (code & 0x1f) & 1) !=
                  0);
  }
  else if (*(undefined8 **)((long)cc_arg + 0x38) == (undefined8 *)0x0) {
    uVar1 = 0;
  }
  else {
    uVar1 = onig_is_in_code_range((OnigUChar *)**(undefined8 **)((long)cc_arg + 0x38),code);
  }
  return *(uint *)((long)cc_arg + 0x10) & 1 ^ uVar1;
}

Assistant:

extern int
onig_is_code_in_cc_len(int elen, OnigCodePoint code, /* CClassNode* */ void* cc_arg)
{
  int found;
  CClassNode* cc = (CClassNode* )cc_arg;

  if (elen > 1 || (code >= SINGLE_BYTE_SIZE)) {
    if (IS_NULL(cc->mbuf)) {
      found = 0;
    }
    else {
      found = onig_is_in_code_range(cc->mbuf->p, code) != 0;
    }
  }
  else {
    found = BITSET_AT(cc->bs, code) != 0;
  }

  if (IS_NCCLASS_NOT(cc))
    return !found;
  else
    return found;
}